

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O2

void __thiscall
duckdb::BufferPool::BufferPool
          (BufferPool *this,idx_t maximum_memory,bool track_eviction_timestamps,
          idx_t allocator_bulk_deallocation_flush_threshold)

{
  long lVar1;
  ulong uVar2;
  FileBufferType type;
  FileBufferType local_49;
  unique_ptr<duckdb::TemporaryMemoryManager,_std::default_delete<duckdb::TemporaryMemoryManager>,_true>
  *local_48;
  long local_40;
  duckdb local_38 [8];
  
  this->_vptr_BufferPool = (_func_int **)&PTR__BufferPool_027c5cc8;
  (this->eviction_queue_sizes)._M_elems[0] = 1;
  (this->eviction_queue_sizes)._M_elems[1] = 6;
  (this->eviction_queue_sizes)._M_elems[2] = 1;
  (this->limit_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->limit_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->limit_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->limit_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->limit_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->maximum_memory).super___atomic_base<unsigned_long>._M_i = maximum_memory;
  (this->allocator_bulk_deallocation_flush_threshold).super___atomic_base<unsigned_long>._M_i =
       allocator_bulk_deallocation_flush_threshold;
  this->track_eviction_timestamps = track_eviction_timestamps;
  (this->queues).
  super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->queues).
  super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->queues).
  super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = &this->temporary_memory_manager;
  make_uniq<duckdb::TemporaryMemoryManager>();
  MemoryUsage::MemoryUsage(&this->memory_usage);
  local_40 = 0;
  while (lVar1 = local_40, lVar1 != 3) {
    local_40 = lVar1 + 1;
    local_49 = (FileBufferType)local_40;
    for (uVar2 = 0; uVar2 < (this->eviction_queue_sizes)._M_elems[lVar1]; uVar2 = uVar2 + 1) {
      make_uniq<duckdb::EvictionQueue,duckdb::FileBufferType_const&>(local_38,&local_49);
      ::std::
      vector<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>,std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>>
                ((vector<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>,std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>>>
                  *)&this->queues,
                 (unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>
                  *)local_38);
      ::std::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>_>::
      ~unique_ptr((unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>_> *)
                  local_38);
    }
  }
  return;
}

Assistant:

BufferPool::BufferPool(idx_t maximum_memory, bool track_eviction_timestamps,
                       idx_t allocator_bulk_deallocation_flush_threshold)
    : eviction_queue_sizes({BLOCK_QUEUE_SIZE, MANAGED_BUFFER_QUEUE_SIZE, TINY_BUFFER_QUEUE_SIZE}),
      maximum_memory(maximum_memory),
      allocator_bulk_deallocation_flush_threshold(allocator_bulk_deallocation_flush_threshold),
      track_eviction_timestamps(track_eviction_timestamps),
      temporary_memory_manager(make_uniq<TemporaryMemoryManager>()) {
	for (uint8_t type_idx = 0; type_idx < FILE_BUFFER_TYPE_COUNT; type_idx++) {
		const auto type = static_cast<FileBufferType>(type_idx + 1);
		const auto &type_queue_size = eviction_queue_sizes[type_idx];
		for (idx_t queue_idx = 0; queue_idx < type_queue_size; queue_idx++) {
			queues.push_back(make_uniq<EvictionQueue>(type));
		}
	}
}